

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

double bsp_time(void)

{
  bool bVar1;
  time_t *in_RSI;
  double extraout_XMM0_Qa;
  
  if ((s_spmd == (Spmd *)0x0) || (bVar1 = bsplib::Spmd::closed(s_spmd), bVar1)) {
    bsp_abort("bsp_time: can only be called within SPMD section\n");
  }
  bsplib::Spmd::time(s_spmd,in_RSI);
  return extraout_XMM0_Qa;
}

Assistant:

double bsp_time()
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_time: can only be called within SPMD section\n");

    return s_spmd->time();
}